

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

Session * __thiscall FIX::Acceptor::getSession(Acceptor *this,string *msg,Responder *responder)

{
  bool bVar1;
  FieldMap *pFVar2;
  StringField *this_00;
  StringField *this_01;
  StringField *this_02;
  StringField *lhs;
  string *psVar3;
  string *senderCompID_00;
  string *targetCompID_00;
  pointer ppVar4;
  FieldNotFound *anon_var_0;
  _Self local_3e0;
  iterator i;
  string local_3d0;
  undefined1 local_3b0 [8];
  SessionID sessionID;
  TargetCompID targetCompID;
  SenderCompID senderCompID;
  MsgType *msgType;
  TargetCompID *clTargetCompID;
  SenderCompID *clSenderCompID;
  BeginString *beginString;
  undefined1 local_180 [8];
  Message message;
  Responder *responder_local;
  string *msg_local;
  Acceptor *this_local;
  
  message._336_8_ = responder;
  Message::Message((Message *)local_180);
  bVar1 = Message::setStringHeader((Message *)local_180,msg);
  if (bVar1) {
    pFVar2 = &Message::getHeader((Message *)local_180)->super_FieldMap;
    this_00 = &FieldMap::getField<FIX::BeginString>(pFVar2)->super_StringField;
    pFVar2 = &Message::getHeader((Message *)local_180)->super_FieldMap;
    this_01 = &FieldMap::getField<FIX::SenderCompID>(pFVar2)->super_StringField;
    pFVar2 = &Message::getHeader((Message *)local_180)->super_FieldMap;
    this_02 = &FieldMap::getField<FIX::TargetCompID>(pFVar2)->super_StringField;
    pFVar2 = &Message::getHeader((Message *)local_180)->super_FieldMap;
    lhs = &FieldMap::getField<FIX::MsgType>(pFVar2)->super_StringField;
    bVar1 = FIX::operator!=(lhs,"A");
    if (bVar1) {
      this_local = (Acceptor *)0x0;
    }
    else {
      psVar3 = StringField::operator_cast_to_string_(this_02);
      SenderCompID::SenderCompID
                ((SenderCompID *)&targetCompID.super_StringField.super_FieldBase.m_metrics,psVar3);
      psVar3 = StringField::operator_cast_to_string_(this_01);
      TargetCompID::TargetCompID
                ((TargetCompID *)((long)&sessionID.m_frozenString.field_2 + 8),psVar3);
      psVar3 = StringField::operator_cast_to_string_(this_00);
      senderCompID_00 =
           StringField::operator_cast_to_string_
                     ((StringField *)&targetCompID.super_StringField.super_FieldBase.m_metrics);
      targetCompID_00 =
           StringField::operator_cast_to_string_
                     ((StringField *)((long)&sessionID.m_frozenString.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"",(allocator<char> *)((long)&i._M_node + 7));
      SessionID::SessionID((SessionID *)local_3b0,psVar3,senderCompID_00,targetCompID_00,&local_3d0)
      ;
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_node + 7));
      local_3e0._M_node =
           (_Base_ptr)
           std::
           map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
           ::find(&this->m_sessions,(key_type *)local_3b0);
      anon_var_0 = (FieldNotFound *)
                   std::
                   map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
                   ::end(&this->m_sessions);
      bVar1 = std::operator!=(&local_3e0,(_Self *)&anon_var_0);
      if (bVar1) {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::
                 operator->(&local_3e0);
        Session::setResponder(ppVar4->second,(Responder *)message._336_8_);
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::
                 operator->(&local_3e0);
        this_local = (Acceptor *)ppVar4->second;
      }
      SessionID::~SessionID((SessionID *)local_3b0);
      TargetCompID::~TargetCompID((TargetCompID *)((long)&sessionID.m_frozenString.field_2 + 8));
      SenderCompID::~SenderCompID
                ((SenderCompID *)&targetCompID.super_StringField.super_FieldBase.m_metrics);
      if (!bVar1) {
        this_local = (Acceptor *)0x0;
      }
    }
  }
  else {
    this_local = (Acceptor *)0x0;
  }
  Message::~Message((Message *)local_180);
  return (Session *)this_local;
}

Assistant:

Session *Acceptor::getSession(const std::string &msg, Responder &responder) {
  Message message;
  if (!message.setStringHeader(msg)) {
    return 0;
  }

  try {
    auto const &beginString = message.getHeader().getField<BeginString>();
    auto const &clSenderCompID = message.getHeader().getField<SenderCompID>();
    auto const &clTargetCompID = message.getHeader().getField<TargetCompID>();
    auto const &msgType = message.getHeader().getField<MsgType>();
    if (msgType != MsgType_Logon) {
      return 0;
    }

    SenderCompID senderCompID(clTargetCompID);
    TargetCompID targetCompID(clSenderCompID);
    SessionID sessionID(beginString, senderCompID, targetCompID);

    Sessions::iterator i = m_sessions.find(sessionID);
    if (i != m_sessions.end()) {
      i->second->setResponder(&responder);
      return i->second;
    }
  } catch (FieldNotFound &) {}
  return 0;
}